

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_add_filter_zstd.c
# Opt level: O1

int drive_compressor(archive_write_filter *f,private_data_conflict9 *data,int flush,void *src,
                    size_t length)

{
  ZSTD_outBuffer *pZVar1;
  anon_enum_32 aVar2;
  size_t sVar3;
  size_t sVar4;
  archive *a;
  int iVar5;
  long lVar6;
  ulong uVar7;
  undefined8 uVar8;
  ulong uVar9;
  ZSTD_inBuffer in;
  void *local_48;
  size_t local_40;
  size_t local_38;
  
  local_38 = 0;
  pZVar1 = &data->out;
  local_48 = src;
  local_40 = length;
  do {
    sVar4 = local_38;
    sVar3 = (data->out).pos;
    aVar2 = data->state;
    if (aVar2 == resetting) {
      ZSTD_CCtx_reset(data->cstream,1);
      data->cur_frame = data->cur_frame + 1;
      data->state = running;
      data->cur_frame_in = 0;
      data->cur_frame_out = 0;
    }
    else if (aVar2 == finishing) {
      lVar6 = ZSTD_endStream(data->cstream,pZVar1);
      iVar5 = ZSTD_isError(lVar6);
      if (iVar5 != 0) {
LAB_001502ed:
        a = f->archive;
        uVar8 = ZSTD_getErrorName(lVar6);
        archive_set_error(a,-1,"Zstd compression failed: %s",uVar8);
        return -0x1e;
      }
      if (lVar6 == 0) {
        data->state = resetting;
      }
    }
    else if (aVar2 == running) {
      if (local_38 == local_40) {
        return 0;
      }
      lVar6 = ZSTD_compressStream(data->cstream,pZVar1,&local_48);
      iVar5 = ZSTD_isError(lVar6);
      if (iVar5 != 0) goto LAB_001502ed;
    }
    data->total_in = data->total_in + (local_38 - sVar4);
    uVar7 = (local_38 - sVar4) + data->cur_frame_in;
    data->cur_frame_in = uVar7;
    sVar4 = (data->out).pos;
    uVar9 = (sVar4 - sVar3) + data->cur_frame_out;
    data->cur_frame_out = uVar9;
    if ((data->state == running) &&
       ((data->max_frame_in <= uVar7 || (data->max_frame_out <= uVar9)))) {
      data->state = finishing;
    }
    if ((sVar4 == (data->out).size) || (flush != 0 && sVar4 != 0)) {
      iVar5 = __archive_write_filter(f->next_filter,pZVar1->dst,sVar4);
      if (iVar5 != 0) {
        return -0x1e;
      }
      (data->out).pos = 0;
    }
  } while( true );
}

Assistant:

static int
drive_compressor(struct archive_write_filter *f,
    struct private_data *data, int flush, const void *src, size_t length)
{
	ZSTD_inBuffer in = { .src = src, .size = length, .pos = 0 };
	size_t ipos, opos, zstdret = 0;
	int ret;

	for (;;) {
		ipos = in.pos;
		opos = data->out.pos;
		switch (data->state) {
		case running:
			if (in.pos == in.size)
				return (ARCHIVE_OK);
			zstdret = ZSTD_compressStream(data->cstream,
			    &data->out, &in);
			if (ZSTD_isError(zstdret))
				goto zstd_fatal;
			break;
		case finishing:
			zstdret = ZSTD_endStream(data->cstream, &data->out);
			if (ZSTD_isError(zstdret))
				goto zstd_fatal;
			if (zstdret == 0)
				data->state = resetting;
			break;
		case resetting:
			ZSTD_CCtx_reset(data->cstream, ZSTD_reset_session_only);
			data->cur_frame++;
			data->cur_frame_in = 0;
			data->cur_frame_out = 0;
			data->state = running;
			break;
		}
		data->total_in += in.pos - ipos;
		data->cur_frame_in += in.pos - ipos;
		data->cur_frame_out += data->out.pos - opos;
		if (data->state == running) {
			if (data->cur_frame_in >= data->max_frame_in ||
			    data->cur_frame_out >= data->max_frame_out) {
				data->state = finishing;
			}
		}
		if (data->out.pos == data->out.size ||
		    (flush && data->out.pos > 0)) {
			ret = __archive_write_filter(f->next_filter,
			    data->out.dst, data->out.pos);
			if (ret != ARCHIVE_OK)
				goto fatal;
			data->out.pos = 0;
		}
	}
zstd_fatal:
	archive_set_error(f->archive, ARCHIVE_ERRNO_MISC,
	    "Zstd compression failed: %s",
	    ZSTD_getErrorName(zstdret));
fatal:
	return (ARCHIVE_FATAL);
}